

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.cpp
# Opt level: O2

void __thiscall
Trie<char,26ul,(char)97>::add<std::__cxx11::string>
          (Trie<char,26ul,(char)97> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *word)

{
  size_type sVar1;
  Trie<char,26ul,(char)97> *__s;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  
  sVar1 = word->_M_string_length;
  pcVar2 = (word->_M_dataplus)._M_p;
  for (pcVar4 = pcVar2; (lVar3 = (long)*pcVar4, lVar3 != 0 && (pcVar4 != pcVar2 + sVar1));
      pcVar4 = pcVar4 + 1) {
    __s = *(Trie<char,26ul,(char)97> **)(this + lVar3 * 8 + -0x308);
    if (*(Trie<char,26ul,(char)97> **)(this + lVar3 * 8 + -0x308) == (Trie<char,26ul,(char)97> *)0x0
       ) {
      __s = (Trie<char,26ul,(char)97> *)operator_new(0xd8);
      memset(__s,0,0xd8);
      *(Trie<char,26ul,(char)97> **)(this + lVar3 * 8 + -0x308) = __s;
      pcVar2 = (word->_M_dataplus)._M_p;
    }
    this = __s;
  }
  *(long *)(this + 0xd0) = *(long *)(this + 0xd0) + 1;
  return;
}

Assistant:

void add(const Iteratable& word) {
    auto root = this;
    for (auto c = std::cbegin(word); *c and c != std::cend(word); ++c) {
      auto index = *c - offset;
      if (root->nodes[index] == nullptr) {
        root->nodes[index] = new Trie<Element, N, offset>();
      }
      root = root->nodes[index];
    }
    root->counter += 1;
  }